

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptPostDecls(HlslGrammar *this,TQualifier *qualifier)

{
  HlslToken *pHVar1;
  pointer pcVar2;
  TSourceLoc loc;
  long lVar3;
  anon_union_8_5_54ae9b2d_for_HlslToken_2 aVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  TBuiltInVariable builtIn;
  char *pcVar8;
  TQualifier *pTVar9;
  HlslParseContext *pHVar10;
  _func_int **pp_Var11;
  undefined8 profile;
  long lVar12;
  TString semanticUpperCase;
  HlslToken spaceDesc;
  HlslToken idToken;
  TString local_d8;
  HlslToken local_a8;
  TQualifier *local_80;
  HlslToken local_78;
  TString *local_48;
  int iStack_40;
  int iStack_3c;
  undefined8 local_38;
  
  pHVar1 = &(this->super_HlslTokenStream).token;
  bVar6 = false;
  do {
    while( true ) {
      bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColon);
      if (bVar5) break;
      pTVar9 = (TQualifier *)0x175;
      bVar5 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
      if (!bVar5) {
        return bVar6;
      }
      acceptAnnotations(this,pTVar9);
      bVar6 = true;
    }
    local_78.field_2.string =
         (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)0x0;
    local_78.loc.name = (TString *)0x0;
    local_78.loc.string = 0;
    local_78.loc.line = 0;
    local_78.loc.column = 0;
    bVar6 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLayout);
    if (bVar6) {
      acceptLayoutQualifierList(this,qualifier);
LAB_0042bb71:
      iVar7 = 0;
    }
    else {
      bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokPackOffset);
      if (bVar6) {
        bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
        if (bVar6) {
          local_d8.field_2._8_8_ = (TString *)0x0;
          local_d8._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)0x0;
          local_d8._M_dataplus._M_p = (pointer)0x0;
          local_d8._M_string_length._0_4_ = 0;
          bVar6 = acceptIdentifier(this,(HlslToken *)&local_d8);
          if (bVar6) {
            local_a8.field_2.string = (TString *)0x0;
            local_a8.loc.name = (TString *)0x0;
            local_a8.loc.string = 0;
            local_a8.loc.line = 0;
            local_a8.loc.column = 0;
            bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokDot);
            if ((bVar6) && (bVar6 = acceptIdentifier(this,&local_a8), !bVar6)) {
              pHVar10 = this->parseContext;
              pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions.
                         _vptr_TParseVersions;
              pcVar8 = "component";
              goto LAB_0042bda3;
            }
            bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
            if (bVar6) {
              HlslParseContext::handlePackOffset
                        (this->parseContext,(TSourceLoc *)&local_d8,qualifier,
                         (TString *)local_d8.field_2._8_8_,local_a8.field_2.string);
LAB_0042bc5d:
              iVar7 = 0;
            }
            else {
LAB_0042bf8b:
              pHVar10 = this->parseContext;
              pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions.
                         _vptr_TParseVersions;
              pcVar8 = ")";
LAB_0042bfa6:
              (*pp_Var11[0x2d])(pHVar10,pHVar1,"Expected",pcVar8,"");
              iVar7 = 2;
            }
          }
          else {
            pHVar10 = this->parseContext;
            pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar8 = "c[subcomponent][.component]";
LAB_0042bda3:
            (*pp_Var11[0x2d])(pHVar10,pHVar1,"Expected",pcVar8,"");
            iVar7 = 1;
          }
          if (iVar7 == 0) goto LAB_0042bb71;
          goto LAB_0042bfc3;
        }
LAB_0042be67:
        pHVar10 = this->parseContext;
        pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar8 = "(";
      }
      else {
        bVar6 = acceptIdentifier(this,&local_78);
        aVar4 = local_78.field_2;
        if (bVar6) {
          iVar7 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(local_78.field_2.string,"register");
          if (iVar7 != 0) {
            local_80 = qualifier;
            local_d8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
            pcVar2 = ((aVar4.string)->_M_dataplus)._M_p;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                 *)&local_d8,pcVar2,pcVar2 + (aVar4.string)->_M_string_length);
            pcVar2 = local_d8._M_dataplus._M_p;
            lVar3 = CONCAT44(local_d8._M_string_length._4_4_,(undefined4)local_d8._M_string_length);
            if (lVar3 != 0) {
              lVar12 = 0;
              do {
                iVar7 = toupper((int)pcVar2[lVar12]);
                pcVar2[lVar12] = (char)iVar7;
                lVar12 = lVar12 + 1;
              } while (lVar3 != lVar12);
            }
            pHVar10 = this->parseContext;
            local_38 = CONCAT44(local_78.loc._20_4_,local_78.loc.column);
            local_48 = local_78.loc.name;
            iStack_40 = local_78.loc.string;
            iStack_3c = local_78.loc.line;
            builtIn = HlslScanContext::mapSemantic
                                ((this->super_HlslTokenStream).scanner,local_d8._M_dataplus._M_p);
            qualifier = local_80;
            loc.string = iStack_40;
            loc.line = iStack_3c;
            loc.name = local_48;
            loc._16_8_ = local_38;
            HlslParseContext::handleSemantic(pHVar10,loc,local_80,builtIn,&local_d8);
            goto LAB_0042bb71;
          }
          bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
          if (!bVar6) goto LAB_0042be67;
          local_d8.field_2._8_8_ = (TString *)0x0;
          local_d8._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)0x0;
          local_d8._M_dataplus._M_p = (pointer)0x0;
          local_d8._M_string_length._0_4_ = 0;
          bVar6 = acceptIdentifier(this,(HlslToken *)&local_d8);
          if (bVar6) {
            if (((*(size_type *)(local_d8.field_2._8_8_ + 0x10) < 2) ||
                ((int)(*(pointer *)(local_d8.field_2._8_8_ + 8))[1] - 0x30U < 10)) ||
               (bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma),
               profile = local_d8.field_2._8_8_, !bVar6)) {
              profile = (TString *)0x0;
            }
            else {
              bVar6 = acceptIdentifier(this,(HlslToken *)&local_d8);
              if (!bVar6) goto LAB_0042be47;
            }
            bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket)
            ;
            iVar7 = 0;
            if (bVar6) {
              bVar6 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant)
              ;
              if (bVar6) {
                iVar7 = (this->super_HlslTokenStream).token.field_2.i;
                HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
                bVar6 = HlslTokenStream::acceptTokenClass
                                  (&this->super_HlslTokenStream,EHTokRightBracket);
                if (bVar6) goto LAB_0042bf0e;
                pHVar10 = this->parseContext;
                pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions.
                           _vptr_TParseVersions;
                pcVar8 = "]";
                goto LAB_0042bfa6;
              }
              pHVar10 = this->parseContext;
              pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions.
                         _vptr_TParseVersions;
              pcVar8 = "literal integer";
            }
            else {
LAB_0042bf0e:
              local_a8.field_2.string = (TString *)0x0;
              local_a8.loc.name = (TString *)0x0;
              local_a8.loc.string = 0;
              local_a8.loc.line = 0;
              local_a8.loc.column = 0;
              bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
              if ((!bVar6) || (bVar6 = acceptIdentifier(this,&local_a8), bVar6)) {
                bVar6 = HlslTokenStream::acceptTokenClass
                                  (&this->super_HlslTokenStream,EHTokRightParen);
                if (bVar6) {
                  HlslParseContext::handleRegister
                            (this->parseContext,(TSourceLoc *)&local_d8,qualifier,(TString *)profile
                             ,(TString *)local_d8.field_2._8_8_,iVar7,local_a8.field_2.string);
                  goto LAB_0042bc5d;
                }
                goto LAB_0042bf8b;
              }
              pHVar10 = this->parseContext;
              pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions.
                         _vptr_TParseVersions;
              pcVar8 = "space identifier";
            }
          }
          else {
LAB_0042be47:
            pHVar10 = this->parseContext;
            pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar8 = "register number description";
          }
          goto LAB_0042bda3;
        }
        pHVar10 = this->parseContext;
        pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar8 = "layout, semantic, packoffset, or register";
      }
      (*pp_Var11[0x2d])(pHVar10,pHVar1,"Expected",pcVar8,"");
      iVar7 = 1;
    }
LAB_0042bfc3:
    bVar6 = true;
    if (iVar7 != 0) {
      return iVar7 == 2;
    }
  } while( true );
}

Assistant:

bool HlslGrammar::acceptPostDecls(TQualifier& qualifier)
{
    bool found = false;

    do {
        // COLON
        if (acceptTokenClass(EHTokColon)) {
            found = true;
            HlslToken idToken;
            if (peekTokenClass(EHTokLayout))
                acceptLayoutQualifierList(qualifier);
            else if (acceptTokenClass(EHTokPackOffset)) {
                // PACKOFFSET LEFT_PAREN c[Subcomponent][.component] RIGHT_PAREN
                if (! acceptTokenClass(EHTokLeftParen)) {
                    expected("(");
                    return false;
                }
                HlslToken locationToken;
                if (! acceptIdentifier(locationToken)) {
                    expected("c[subcomponent][.component]");
                    return false;
                }
                HlslToken componentToken;
                if (acceptTokenClass(EHTokDot)) {
                    if (! acceptIdentifier(componentToken)) {
                        expected("component");
                        return false;
                    }
                }
                if (! acceptTokenClass(EHTokRightParen)) {
                    expected(")");
                    break;
                }
                parseContext.handlePackOffset(locationToken.loc, qualifier, *locationToken.string, componentToken.string);
            } else if (! acceptIdentifier(idToken)) {
                expected("layout, semantic, packoffset, or register");
                return false;
            } else if (*idToken.string == "register") {
                // REGISTER LEFT_PAREN [shader_profile,] Type#[subcomp]opt (COMMA SPACEN)opt RIGHT_PAREN
                // LEFT_PAREN
                if (! acceptTokenClass(EHTokLeftParen)) {
                    expected("(");
                    return false;
                }
                HlslToken registerDesc;  // for Type#
                HlslToken profile;
                if (! acceptIdentifier(registerDesc)) {
                    expected("register number description");
                    return false;
                }
                if (registerDesc.string->size() > 1 && !isdigit((*registerDesc.string)[1]) &&
                                                       acceptTokenClass(EHTokComma)) {
                    // Then we didn't really see the registerDesc yet, it was
                    // actually the profile.  Adjust...
                    profile = registerDesc;
                    if (! acceptIdentifier(registerDesc)) {
                        expected("register number description");
                        return false;
                    }
                }
                int subComponent = 0;
                if (acceptTokenClass(EHTokLeftBracket)) {
                    // LEFT_BRACKET subcomponent RIGHT_BRACKET
                    if (! peekTokenClass(EHTokIntConstant)) {
                        expected("literal integer");
                        return false;
                    }
                    subComponent = token.i;
                    advanceToken();
                    if (! acceptTokenClass(EHTokRightBracket)) {
                        expected("]");
                        break;
                    }
                }
                // (COMMA SPACEN)opt
                HlslToken spaceDesc;
                if (acceptTokenClass(EHTokComma)) {
                    if (! acceptIdentifier(spaceDesc)) {
                        expected ("space identifier");
                        return false;
                    }
                }
                // RIGHT_PAREN
                if (! acceptTokenClass(EHTokRightParen)) {
                    expected(")");
                    break;
                }
                parseContext.handleRegister(registerDesc.loc, qualifier, profile.string, *registerDesc.string, subComponent, spaceDesc.string);
            } else {
                // semantic, in idToken.string
                TString semanticUpperCase = *idToken.string;
                std::transform(semanticUpperCase.begin(), semanticUpperCase.end(), semanticUpperCase.begin(), ::toupper);
                parseContext.handleSemantic(idToken.loc, qualifier, mapSemantic(semanticUpperCase.c_str()), semanticUpperCase);
            }
        } else if (peekTokenClass(EHTokLeftAngle)) {
            found = true;
            acceptAnnotations(qualifier);
        } else
            break;

    } while (true);

    return found;
}